

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MismatchedCharException.cpp
# Opt level: O1

void __thiscall
antlr::MismatchedCharException::MismatchedCharException(MismatchedCharException *this)

{
  string local_38;
  
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"Mismatched char","");
  RecognitionException::RecognitionException(&this->super_RecognitionException,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  (this->super_RecognitionException).super_ANTLRException._vptr_ANTLRException =
       (_func_int **)&PTR__MismatchedCharException_002f9298;
  BitSet::BitSet(&this->set,0x40);
  return;
}

Assistant:

MismatchedCharException::MismatchedCharException()
  : RecognitionException("Mismatched char")
{}